

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> __thiscall
wabt::
MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::MemoryImport,std::default_delete<wabt::MemoryImport>>,wabt::Location&>
          (wabt *this,unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> *args
          ,Location *args_1)

{
  ImportModuleField *this_00;
  unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_> local_28;
  Location *local_20;
  Location *args_local_1;
  unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> *args_local;
  
  local_20 = args_1;
  args_local_1 = (Location *)args;
  args_local = (unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> *)this;
  this_00 = (ImportModuleField *)operator_new(0x48);
  std::unique_ptr<wabt::Import,std::default_delete<wabt::Import>>::
  unique_ptr<wabt::MemoryImport,std::default_delete<wabt::MemoryImport>,void>
            ((unique_ptr<wabt::Import,std::default_delete<wabt::Import>> *)&local_28,
             (unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> *)
             args_local_1);
  ImportModuleField::ImportModuleField(this_00,&local_28,local_20);
  std::unique_ptr<wabt::ImportModuleField,std::default_delete<wabt::ImportModuleField>>::
  unique_ptr<std::default_delete<wabt::ImportModuleField>,void>
            ((unique_ptr<wabt::ImportModuleField,std::default_delete<wabt::ImportModuleField>> *)
             this,this_00);
  std::unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_>::~unique_ptr(&local_28);
  return (__uniq_ptr_data<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>,_true,_true>
          )(__uniq_ptr_data<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}